

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

double xmlXPathStringEvalNumber(xmlChar *str)

{
  uint uVar1;
  byte *pbVar2;
  byte bVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  xmlChar *cur;
  byte *pbVar12;
  byte *pbVar13;
  double dVar14;
  double dVar15;
  
  if (str == (xmlChar *)0x0) {
    return 0.0;
  }
  while( true ) {
    bVar3 = *str;
    uVar11 = (ulong)bVar3;
    if (0x2e < uVar11) break;
    if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) {
      if (uVar11 == 0x2e) goto LAB_001e1882;
      break;
    }
    str = str + 1;
  }
  if (bVar3 != 0x2d && 9 < (byte)(bVar3 - 0x30)) {
    return NAN;
  }
LAB_001e1882:
  uVar11 = (ulong)(bVar3 == 0x2d);
  bVar9 = str[uVar11];
  bVar7 = bVar9 - 0x30;
  if (bVar7 < 10) {
    dVar4 = 0.0;
    do {
      dVar4 = (double)(bVar9 & 0xf) + dVar4 * 10.0;
      bVar9 = str[uVar11 + 1];
      uVar11 = uVar11 + 1;
    } while ((byte)(bVar9 - 0x30) < 10);
  }
  else {
    dVar4 = 0.0;
  }
  pbVar12 = str + uVar11;
  if (bVar9 != 0x2e) goto LAB_001e19b4;
  pbVar13 = pbVar12 + 1;
  pbVar12 = pbVar12 + 1;
  if (*pbVar13 < 0x30) {
    if (9 < bVar7) goto LAB_001e18fd;
LAB_001e1904:
    uVar8 = 0;
    if (*pbVar12 == 0x30) {
      uVar8 = 0;
      pbVar13 = pbVar12;
      do {
        uVar8 = uVar8 + 1;
        pbVar12 = pbVar13 + 1;
        pbVar2 = pbVar13 + 1;
        pbVar13 = pbVar12;
      } while (*pbVar2 == 0x30);
    }
    bVar9 = *pbVar12;
    dVar15 = 0.0;
    if ((byte)(bVar9 - 0x30) < 10) {
      uVar1 = uVar8 + 0x14;
      do {
        dVar15 = dVar15 * 10.0 + (double)(int)(bVar9 - 0x30);
        uVar8 = uVar8 + 1;
        bVar9 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
        if (9 < (byte)(bVar9 - 0x30)) break;
      } while (uVar8 < uVar1);
    }
    dVar14 = pow(10.0,(double)(int)uVar8);
    pbVar12 = pbVar12 + -1;
    do {
      pbVar13 = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
    } while ((byte)(*pbVar13 - 0x30) < 10);
    dVar4 = dVar4 + dVar15 / dVar14;
    bVar5 = true;
  }
  else {
    if ((bVar7 < 10) || (*pbVar13 < 0x3a)) goto LAB_001e1904;
LAB_001e18fd:
    bVar5 = false;
  }
  if (!bVar5) {
    return NAN;
  }
LAB_001e19b4:
  if ((*pbVar12 | 0x20) == 0x65) {
    bVar5 = false;
    if (pbVar12[1] == 0x2b) {
      pbVar12 = pbVar12 + 2;
    }
    else if (pbVar12[1] == 0x2d) {
      pbVar12 = pbVar12 + 2;
      bVar5 = true;
    }
    else {
      pbVar12 = pbVar12 + 1;
    }
    bVar9 = *pbVar12;
    if ((byte)(bVar9 - 0x30) < 10) {
      iVar10 = 0;
      do {
        iVar6 = (bVar9 - 0x30) + iVar10 * 10;
        if (999999 < iVar10) {
          iVar6 = iVar10;
        }
        iVar10 = iVar6;
        bVar9 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      } while ((byte)(bVar9 - 0x30) < 10);
    }
    else {
      iVar10 = 0;
    }
  }
  else {
    iVar10 = 0;
    bVar5 = false;
  }
  while( true ) {
    uVar11 = (ulong)*pbVar12;
    if (0x20 < uVar11) {
      return NAN;
    }
    if ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0) break;
    pbVar12 = pbVar12 + 1;
  }
  if (uVar11 != 0) {
    return NAN;
  }
  if (bVar3 == 0x2d) {
    dVar4 = -dVar4;
  }
  iVar6 = -iVar10;
  if (!bVar5) {
    iVar6 = iVar10;
  }
  dVar15 = pow(10.0,(double)iVar6);
  return dVar15 * dVar4;
}

Assistant:

double
xmlXPathStringEvalNumber(const xmlChar *str) {
    const xmlChar *cur = str;
    double ret;
    int ok = 0;
    int isneg = 0;
    int exponent = 0;
    int is_exponent_negative = 0;
#ifdef __GNUC__
    unsigned long tmp = 0;
    double temp;
#endif
    if (cur == NULL) return(0);
    while (IS_BLANK_CH(*cur)) cur++;
    if ((*cur != '.') && ((*cur < '0') || (*cur > '9')) && (*cur != '-')) {
        return(NAN);
    }
    if (*cur == '-') {
	isneg = 1;
	cur++;
    }

#ifdef __GNUC__
    /*
     * tmp/temp is a workaround against a gcc compiler bug
     * http://veillard.com/gcc.bug
     */
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10;
	tmp = (*cur - '0');
	ok = 1;
	cur++;
	temp = (double) tmp;
	ret = ret + temp;
    }
#else
    ret = 0;
    while ((*cur >= '0') && (*cur <= '9')) {
	ret = ret * 10 + (*cur - '0');
	ok = 1;
	cur++;
    }
#endif

    if (*cur == '.') {
	int v, frac = 0, max;
	double fraction = 0;

        cur++;
	if (((*cur < '0') || (*cur > '9')) && (!ok)) {
	    return(NAN);
	}
        while (*cur == '0') {
	    frac = frac + 1;
	    cur++;
        }
        max = frac + MAX_FRAC;
	while (((*cur >= '0') && (*cur <= '9')) && (frac < max)) {
	    v = (*cur - '0');
	    fraction = fraction * 10 + v;
	    frac = frac + 1;
	    cur++;
	}
	fraction /= pow(10.0, frac);
	ret = ret + fraction;
	while ((*cur >= '0') && (*cur <= '9'))
	    cur++;
    }
    if ((*cur == 'e') || (*cur == 'E')) {
      cur++;
      if (*cur == '-') {
	is_exponent_negative = 1;
	cur++;
      } else if (*cur == '+') {
        cur++;
      }
      while ((*cur >= '0') && (*cur <= '9')) {
        if (exponent < 1000000)
	  exponent = exponent * 10 + (*cur - '0');
	cur++;
      }
    }
    while (IS_BLANK_CH(*cur)) cur++;
    if (*cur != 0) return(NAN);
    if (isneg) ret = -ret;
    if (is_exponent_negative) exponent = -exponent;
    ret *= pow(10.0, (double)exponent);
    return(ret);
}